

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  __m256i alVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  uint uVar11;
  int iVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  __m256i *palVar15;
  __m256i *ptr;
  __m256i *ptr_00;
  int64_t *ptr_01;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  int iVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined8 uVar45;
  int iVar46;
  ulong uVar47;
  ulong uVar48;
  uint uVar49;
  ulong size;
  ulong uVar50;
  long lVar51;
  __m256i *palVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  __m256i_64_t e;
  __m256i_64_t h;
  int local_26c;
  long local_258;
  longlong local_a0 [4];
  longlong local_80 [10];
  undefined1 auVar87 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_avx2_256_64_cold_4();
        }
        else {
          uVar31 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_striped_profile_avx2_256_64_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_striped_profile_avx2_256_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_striped_profile_avx2_256_64_cold_1();
          }
          else {
            iVar46 = uVar3 - 1;
            uVar1 = (ulong)uVar3 + 3;
            size = uVar1 >> 2;
            uVar49 = (uint)size;
            iVar13 = iVar46 / (int)uVar49;
            uVar27 = iVar46 % (int)uVar49;
            uVar21 = (ulong)(uint)open;
            iVar39 = -open;
            iVar20 = ppVar5->min;
            uVar34 = 0x8000000000000000 - (long)iVar20;
            if (iVar20 != iVar39 && SBORROW4(iVar20,iVar39) == iVar20 + open < 0) {
              uVar34 = uVar21 | 0x8000000000000000;
            }
            iVar20 = ppVar5->max;
            ppVar14 = parasail_result_new_table1((uint)uVar1 & 0x7ffffffc,s2Len);
            if (ppVar14 != (parasail_result_t *)0x0) {
              ppVar14->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar14->flag | 0x4820802;
              palVar15 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
              if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                  (ptr != (__m256i *)0x0 && palVar15 != (__m256i *)0x0)) {
                iVar19 = s2Len + -1;
                iVar28 = 3 - iVar13;
                auVar103 = ZEXT2864(CONCAT424(open,CONCAT420(0,CONCAT416(open,CONCAT412(0,CONCAT48(
                                                  open,uVar21))))));
                uVar37 = (ulong)(uint)gap;
                auVar74 = ZEXT2864(CONCAT424(gap,CONCAT420(0,CONCAT416(gap,CONCAT412(0,CONCAT48(gap,
                                                  uVar37))))));
                lVar22 = uVar34 + 1;
                lVar35 = 0x7ffffffffffffffe - (long)iVar20;
                auVar85._8_8_ = lVar35;
                auVar85._0_8_ = lVar35;
                auVar85._16_8_ = lVar35;
                auVar85._24_8_ = lVar35;
                auVar87 = ZEXT3264(auVar85);
                lVar35 = (long)iVar39;
                uVar34 = 0;
                do {
                  lVar38 = 0;
                  lVar36 = lVar35;
                  do {
                    lVar26 = lVar36;
                    if (s1_beg != 0) {
                      lVar26 = 0;
                    }
                    local_80[lVar38] = lVar26;
                    local_a0[lVar38] = lVar26 - uVar21;
                    lVar38 = lVar38 + 1;
                    lVar36 = lVar36 - size * uVar37;
                  } while (lVar38 != 4);
                  palVar52 = palVar15 + uVar34;
                  (*palVar52)[0] = local_80[0];
                  (*palVar52)[1] = local_80[1];
                  (*palVar52)[2] = local_80[2];
                  (*palVar52)[3] = local_80[3];
                  palVar52 = ptr_00 + uVar34;
                  (*palVar52)[0] = local_a0[0];
                  (*palVar52)[1] = local_a0[1];
                  (*palVar52)[2] = local_a0[2];
                  (*palVar52)[3] = local_a0[3];
                  uVar34 = uVar34 + 1;
                  lVar35 = lVar35 - uVar37;
                } while (uVar34 != size);
                *ptr_01 = 0;
                uVar34 = 1;
                iVar20 = iVar39;
                do {
                  iVar29 = 0;
                  if (s2_beg == 0) {
                    iVar29 = iVar20;
                  }
                  ptr_01[uVar34] = (long)iVar29;
                  uVar34 = uVar34 + 1;
                  iVar20 = iVar20 - gap;
                } while (s2Len + 1 != uVar34);
                uVar34 = 1;
                if (1 < s2Len) {
                  uVar34 = uVar31;
                }
                lVar36 = size * uVar31;
                lVar35 = (ulong)(uVar49 + (uVar49 == 0)) << 5;
                lVar38 = 0;
                auVar59._0_8_ = -(ulong)(iVar28 == 3);
                auVar59._8_8_ = -(ulong)(iVar28 == 2);
                auVar59._16_8_ = -(ulong)(iVar28 == 1);
                auVar59._24_8_ = -(ulong)(iVar28 == 0);
                uVar37 = 0;
                auVar8._8_8_ = lVar22;
                auVar8._0_8_ = lVar22;
                auVar8._16_8_ = lVar22;
                auVar8._24_8_ = lVar22;
                auVar83 = ZEXT3264(auVar8);
                auVar66 = ZEXT3264(auVar8);
                auVar8 = auVar59;
                local_26c = iVar19;
                do {
                  palVar52 = ptr;
                  ptr = palVar15;
                  auVar88 = SUB3216(ptr[uVar49 - 1],0);
                  auVar92._0_16_ = ZEXT116(0) * auVar88 + ZEXT116(1) * auVar8._0_16_;
                  auVar92._16_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar88;
                  auVar8 = vpalignr_avx2((undefined1  [32])ptr[uVar49 - 1],auVar92,8);
                  iVar20 = ppVar5->mapper[(byte)s2[uVar37]];
                  auVar8 = vpblendd_avx2(auVar8,ZEXT832((ulong)ptr_01[uVar37]),3);
                  lVar26 = 0;
                  auVar90 = ZEXT3264(CONCAT824(lVar22,CONCAT816(lVar22,CONCAT88(lVar22,lVar22))));
                  local_258 = lVar38;
                  do {
                    auVar8 = vpaddq_avx2(auVar8,*(undefined1 (*) [32])
                                                 ((long)pvVar4 + lVar26 + size * (long)iVar20 * 0x20
                                                 ));
                    uVar17 = *(ulong *)((long)*ptr_00 + lVar26);
                    uVar18 = auVar8._0_8_;
                    if ((long)auVar8._0_8_ <= (long)uVar17) {
                      uVar18 = uVar17;
                    }
                    uVar30 = *(ulong *)((long)*ptr_00 + lVar26 + 8);
                    uVar54 = vpextrq_avx(auVar8._0_16_,1);
                    if ((long)uVar54 <= (long)uVar30) {
                      uVar54 = uVar30;
                    }
                    uVar16 = *(ulong *)((long)*ptr_00 + lVar26 + 0x10);
                    uVar55 = auVar8._16_8_;
                    if ((long)auVar8._16_8_ <= (long)uVar16) {
                      uVar55 = uVar16;
                    }
                    uVar41 = *(ulong *)((long)*ptr_00 + lVar26 + 0x18);
                    uVar50 = vpextrq_avx(auVar8._16_16_,1);
                    if ((long)uVar50 <= (long)uVar41) {
                      uVar50 = uVar41;
                    }
                    uVar33 = auVar90._0_8_;
                    if ((long)uVar18 <= (long)uVar33) {
                      uVar18 = uVar33;
                    }
                    uVar23 = vpextrq_avx(auVar90._0_16_,1);
                    if ((long)uVar54 <= (long)uVar23) {
                      uVar54 = uVar23;
                    }
                    uVar48 = auVar90._16_8_;
                    if ((long)uVar55 <= (long)uVar48) {
                      uVar55 = uVar48;
                    }
                    uVar24 = vpextrq_avx(auVar90._16_16_,1);
                    if ((long)uVar50 <= (long)uVar24) {
                      uVar50 = uVar24;
                    }
                    uVar44 = auVar83._0_8_;
                    if ((long)auVar83._0_8_ <= (long)uVar18) {
                      uVar44 = uVar18;
                    }
                    uVar25 = vpextrq_avx(auVar83._0_16_,1);
                    if ((long)uVar25 <= (long)uVar54) {
                      uVar25 = uVar54;
                    }
                    uVar47 = auVar83._16_8_;
                    if ((long)auVar83._16_8_ <= (long)uVar55) {
                      uVar47 = uVar55;
                    }
                    uVar42 = vpextrq_avx(auVar83._16_16_,1);
                    if ((long)uVar42 <= (long)uVar50) {
                      uVar42 = uVar50;
                    }
                    uVar32 = auVar87._0_8_;
                    if ((long)uVar18 <= (long)auVar87._0_8_) {
                      uVar32 = uVar18;
                    }
                    uVar53 = vpextrq_avx(auVar87._0_16_,1);
                    if ((long)uVar54 <= (long)uVar53) {
                      uVar53 = uVar54;
                    }
                    uVar43 = auVar87._16_8_;
                    if ((long)uVar55 <= (long)auVar87._16_8_) {
                      uVar43 = uVar55;
                    }
                    uVar40 = vpextrq_avx(auVar87._16_16_,1);
                    if ((long)uVar50 <= (long)uVar40) {
                      uVar40 = uVar50;
                    }
                    if ((long)uVar17 <= (long)uVar32) {
                      uVar32 = uVar17;
                    }
                    if ((long)uVar30 <= (long)uVar53) {
                      uVar53 = uVar30;
                    }
                    if ((long)uVar16 <= (long)uVar43) {
                      uVar43 = uVar16;
                    }
                    if ((long)uVar41 <= (long)uVar40) {
                      uVar40 = uVar41;
                    }
                    if ((long)uVar33 <= (long)uVar32) {
                      uVar32 = uVar33;
                    }
                    if ((long)uVar23 <= (long)uVar53) {
                      uVar53 = uVar23;
                    }
                    auVar8 = *(undefined1 (*) [32])((long)*ptr_00 + lVar26);
                    auVar88._8_8_ = 0;
                    auVar88._0_8_ = uVar54;
                    auVar96._8_8_ = 0;
                    auVar96._0_8_ = uVar18;
                    auVar88 = vpunpcklqdq_avx(auVar96,auVar88);
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = uVar55;
                    auVar73._0_16_ = ZEXT116(0) * auVar97 + ZEXT116(1) * auVar88;
                    auVar73._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar97;
                    auVar99._8_8_ = uVar50;
                    auVar99._0_8_ = uVar50;
                    auVar99._16_8_ = uVar50;
                    auVar99._24_8_ = uVar50;
                    auVar92 = vpblendd_avx2(auVar73,auVar99,0xc0);
                    *(undefined1 (*) [32])((long)*palVar52 + lVar26) = auVar92;
                    if ((long)uVar48 <= (long)uVar43) {
                      uVar43 = uVar48;
                    }
                    if ((long)uVar24 <= (long)uVar40) {
                      uVar40 = uVar24;
                    }
                    piVar6 = ((ppVar14->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + local_258) = (int)uVar18;
                    *(int *)((long)piVar6 + lVar36 * 4 + local_258) = (int)uVar54;
                    auVar99 = auVar103._0_32_;
                    auVar92 = vpsubq_avx2(auVar92,auVar99);
                    auVar73 = auVar74._0_32_;
                    auVar8 = vpsubq_avx2(auVar8,auVar73);
                    uVar17 = auVar92._0_8_;
                    uVar18 = auVar8._0_8_;
                    if ((long)auVar8._0_8_ <= (long)uVar17) {
                      uVar18 = uVar17;
                    }
                    uVar54 = vpextrq_avx(auVar8._0_16_,1);
                    uVar30 = vpextrq_avx(auVar92._0_16_,1);
                    *(int *)((long)piVar6 + lVar36 * 8 + local_258) = (int)uVar55;
                    if ((long)uVar54 <= (long)uVar30) {
                      uVar54 = uVar30;
                    }
                    *(int *)((long)piVar6 + lVar36 * 0xc + local_258) = (int)uVar50;
                    uVar55 = auVar92._16_8_;
                    uVar16 = auVar8._16_8_;
                    if ((long)auVar8._16_8_ <= (long)uVar55) {
                      uVar16 = uVar55;
                    }
                    uVar50 = vpextrq_avx(auVar8._16_16_,1);
                    uVar41 = vpextrq_avx(auVar92._16_16_,1);
                    if ((long)uVar50 <= (long)uVar41) {
                      uVar50 = uVar41;
                    }
                    auVar8 = vpsubq_avx2(auVar90._0_32_,auVar73);
                    if ((long)uVar17 < (long)auVar8._0_8_) {
                      uVar17 = auVar8._0_8_;
                    }
                    uVar33 = vpextrq_avx(auVar8._0_16_,1);
                    if ((long)uVar30 < (long)uVar33) {
                      uVar30 = uVar33;
                    }
                    if ((long)uVar55 < (long)auVar8._16_8_) {
                      uVar55 = auVar8._16_8_;
                    }
                    uVar33 = vpextrq_avx(auVar8._16_16_,1);
                    if ((long)uVar41 < (long)uVar33) {
                      uVar41 = uVar33;
                    }
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = uVar42;
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar47;
                    auVar88 = vpunpcklqdq_avx(auVar84,auVar9);
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = uVar25;
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = uVar44;
                    auVar96 = vpunpcklqdq_avx(auVar80,auVar7);
                    auVar83 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                  ZEXT116(1) * auVar88,
                                                  ZEXT116(0) * auVar88 + ZEXT116(1) * auVar96));
                    auVar91._8_8_ = 0;
                    auVar91._0_8_ = uVar40;
                    auVar98._8_8_ = 0;
                    auVar98._0_8_ = uVar43;
                    auVar88 = vpunpcklqdq_avx(auVar98,auVar91);
                    auVar100._8_8_ = 0;
                    auVar100._0_8_ = uVar53;
                    auVar101._8_8_ = 0;
                    auVar101._0_8_ = uVar32;
                    auVar96 = vpunpcklqdq_avx(auVar101,auVar100);
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = uVar18;
                    auVar102._8_8_ = 0;
                    auVar102._0_8_ = uVar54;
                    auVar97 = vpunpcklqdq_avx(auVar61,auVar102);
                    auVar103 = ZEXT3264(auVar99);
                    auVar74 = ZEXT3264(auVar73);
                    auVar57._8_8_ = 0;
                    auVar57._0_8_ = uVar16;
                    auVar89._8_8_ = 0;
                    auVar89._0_8_ = uVar50;
                    auVar7 = vpunpcklqdq_avx(auVar57,auVar89);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar26 + 0x10) = auVar7;
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar26) = auVar97;
                    auVar87 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar88,
                                                  ZEXT116(0) * auVar88 + ZEXT116(1) * auVar96));
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = uVar55;
                    auVar78._8_8_ = 0;
                    auVar78._0_8_ = uVar41;
                    auVar88 = vpunpcklqdq_avx(auVar75,auVar78);
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = uVar30;
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = uVar17;
                    auVar96 = vpunpcklqdq_avx(auVar93,auVar67);
                    auVar90 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar88,
                                                  ZEXT116(0) * auVar88 + ZEXT116(1) * auVar96));
                    auVar8 = *(undefined1 (*) [32])((long)*ptr + lVar26);
                    lVar26 = lVar26 + 0x20;
                    local_258 = local_258 + uVar31 * 4;
                  } while (lVar35 != lVar26);
                  uVar11 = 0;
                  do {
                    uVar17 = (long)iVar39;
                    if (s2_beg == 0) {
                      uVar17 = ptr_01[uVar37 + 1] - uVar21;
                    }
                    auVar8 = vpermq_avx2(auVar90._0_32_,0x90);
                    auVar8 = vpblendd_avx2(auVar8,ZEXT832(uVar17),3);
                    auVar90 = ZEXT3264(auVar8);
                    bVar56 = true;
                    uVar17 = 1;
                    lVar51 = 0;
                    lVar26 = lVar38;
                    do {
                      uVar18 = *(ulong *)((long)*palVar52 + lVar51);
                      uVar30 = auVar90._0_8_;
                      if ((long)auVar90._0_8_ < (long)uVar18) {
                        uVar30 = uVar18;
                      }
                      uVar54 = vpextrq_avx(auVar90._0_16_,1);
                      uVar18 = *(ulong *)((long)*palVar52 + lVar51 + 8);
                      if ((long)uVar54 < (long)uVar18) {
                        uVar54 = uVar18;
                      }
                      uVar18 = *(ulong *)((long)*palVar52 + lVar51 + 0x10);
                      uVar16 = auVar90._16_8_;
                      if ((long)auVar90._16_8_ < (long)uVar18) {
                        uVar16 = uVar18;
                      }
                      auVar62._8_8_ = 0;
                      auVar62._0_8_ = uVar54;
                      auVar68._8_8_ = 0;
                      auVar68._0_8_ = uVar30;
                      auVar88 = vpunpcklqdq_avx(auVar68,auVar62);
                      uVar55 = vpextrq_avx(auVar90._16_16_,1);
                      uVar18 = *(ulong *)((long)*palVar52 + lVar51 + 0x18);
                      if ((long)uVar55 < (long)uVar18) {
                        uVar55 = uVar18;
                      }
                      auVar69._8_8_ = 0;
                      auVar69._0_8_ = uVar16;
                      auVar60._0_16_ = ZEXT116(0) * auVar69 + ZEXT116(1) * auVar88;
                      auVar60._16_16_ = ZEXT116(1) * auVar69;
                      auVar65._8_8_ = uVar55;
                      auVar65._0_8_ = uVar55;
                      auVar65._16_8_ = uVar55;
                      auVar65._24_8_ = uVar55;
                      auVar8 = vpblendd_avx2(auVar60,auVar65,0xc0);
                      *(undefined1 (*) [32])((long)*palVar52 + lVar51) = auVar8;
                      uVar18 = auVar87._0_8_;
                      if ((long)uVar30 <= (long)auVar87._0_8_) {
                        uVar18 = uVar30;
                      }
                      uVar41 = vpextrq_avx(auVar87._0_16_,1);
                      if ((long)uVar54 <= (long)uVar41) {
                        uVar41 = uVar54;
                      }
                      uVar50 = auVar87._16_8_;
                      if ((long)uVar16 <= (long)auVar87._16_8_) {
                        uVar50 = uVar16;
                      }
                      uVar33 = vpextrq_avx(auVar87._16_16_,1);
                      if ((long)uVar55 <= (long)uVar33) {
                        uVar33 = uVar55;
                      }
                      uVar23 = auVar83._0_8_;
                      if ((long)auVar83._0_8_ <= (long)uVar30) {
                        uVar23 = uVar30;
                      }
                      uVar48 = vpextrq_avx(auVar83._0_16_,1);
                      if ((long)uVar48 <= (long)uVar54) {
                        uVar48 = uVar54;
                      }
                      uVar24 = auVar83._16_8_;
                      if ((long)auVar83._16_8_ <= (long)uVar16) {
                        uVar24 = uVar16;
                      }
                      uVar44 = vpextrq_avx(auVar83._16_16_,1);
                      if ((long)uVar44 <= (long)uVar55) {
                        uVar44 = uVar55;
                      }
                      piVar6 = ((ppVar14->field_4).rowcols)->score_row;
                      *(int *)((long)piVar6 + lVar26) = (int)uVar30;
                      *(int *)((long)piVar6 + lVar36 * 4 + lVar26) = (int)uVar54;
                      *(int *)((long)piVar6 + lVar36 * 8 + lVar26) = (int)uVar16;
                      *(int *)((long)piVar6 + lVar36 * 0xc + lVar26) = (int)uVar55;
                      auVar58._8_8_ = 0;
                      auVar58._0_8_ = uVar33;
                      auVar63._8_8_ = 0;
                      auVar63._0_8_ = uVar50;
                      auVar88 = vpunpcklqdq_avx(auVar63,auVar58);
                      auVar70._8_8_ = 0;
                      auVar70._0_8_ = uVar41;
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ = uVar18;
                      auVar96 = vpunpcklqdq_avx(auVar76,auVar70);
                      auVar86._0_16_ = ZEXT116(0) * auVar88 + ZEXT116(1) * auVar96;
                      auVar86._16_16_ = ZEXT116(1) * auVar88;
                      auVar87._0_32_ = auVar86;
                      auVar79._8_8_ = 0;
                      auVar79._0_8_ = uVar44;
                      auVar81._8_8_ = 0;
                      auVar81._0_8_ = uVar24;
                      auVar88 = vpunpcklqdq_avx(auVar81,auVar79);
                      auVar94._8_8_ = 0;
                      auVar94._0_8_ = uVar48;
                      auVar95._8_8_ = 0;
                      auVar95._0_8_ = uVar23;
                      auVar96 = vpunpcklqdq_avx(auVar95,auVar94);
                      auVar82._0_16_ = ZEXT116(0) * auVar88 + ZEXT116(1) * auVar96;
                      auVar82._16_16_ = ZEXT116(1) * auVar88;
                      auVar83 = ZEXT3264(auVar82);
                      auVar8 = vpsubq_avx2(auVar8,auVar99);
                      auVar92 = vpsubq_avx2(auVar90._0_32_,auVar73);
                      auVar90 = ZEXT3264(auVar92);
                      auVar8 = vpcmpgtq_avx2(auVar92,auVar8);
                      if ((((auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar8 >> 0x7f,0) == '\0') && SUB321(auVar8 >> 0xbf,0) == '\0') &&
                          -1 < auVar8[0x1f]) break;
                      bVar56 = uVar17 < size;
                      lVar51 = lVar51 + 0x20;
                      lVar26 = lVar26 + uVar31 * 4;
                      uVar17 = uVar17 + 1;
                    } while (lVar35 != lVar51);
                  } while ((!bVar56) && (bVar56 = uVar11 < 3, uVar11 = uVar11 + 1, bVar56));
                  auVar8 = vpcmpgtq_avx2((undefined1  [32])palVar52[uVar27],auVar66._0_32_);
                  uVar17 = auVar66._0_8_;
                  if ((long)auVar66._0_8_ < palVar52[uVar27][0]) {
                    uVar17 = palVar52[uVar27][0];
                  }
                  uVar18 = vpextrq_avx(auVar66._0_16_,1);
                  if ((long)uVar18 < palVar52[uVar27][1]) {
                    uVar18 = palVar52[uVar27][1];
                  }
                  uVar30 = auVar66._16_8_;
                  if ((long)auVar66._16_8_ < palVar52[uVar27][2]) {
                    uVar30 = palVar52[uVar27][2];
                  }
                  uVar54 = vpextrq_avx(auVar66._16_16_,1);
                  if ((long)uVar54 < palVar52[uVar27][3]) {
                    uVar54 = palVar52[uVar27][3];
                  }
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = uVar54;
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = uVar30;
                  auVar88 = vpunpcklqdq_avx(auVar71,auVar64);
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar18;
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = uVar17;
                  auVar96 = vpunpcklqdq_avx(auVar77,auVar72);
                  auVar92 = auVar59 & auVar8;
                  if ((((auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar92 >> 0x7f,0) != '\0') || SUB321(auVar92 >> 0xbf,0) != '\0') ||
                      auVar92[0x1f] < '\0') {
                    local_26c = (int)uVar37;
                  }
                  auVar97 = ZEXT116(1) * auVar88;
                  auVar66 = ZEXT3264(CONCAT1616(auVar97,ZEXT116(0) * auVar88 + ZEXT116(1) * auVar96)
                                    );
                  uVar37 = uVar37 + 1;
                  lVar38 = lVar38 + 4;
                  palVar15 = palVar52;
                  if (uVar37 == uVar34) {
                    lVar35 = lVar22;
                    if (s2_end != 0) {
                      if (iVar13 < 3) {
                        iVar20 = 1;
                        if (1 < iVar28) {
                          iVar20 = iVar28;
                        }
                        do {
                          auVar59 = auVar66._0_32_;
                          auVar8 = vperm2i128_avx2(auVar59,auVar59,8);
                          auVar8 = vpalignr_avx2(auVar59,auVar8,8);
                          auVar97 = auVar8._16_16_;
                          auVar66 = ZEXT3264(auVar8);
                          iVar20 = iVar20 + -1;
                        } while (iVar20 != 0);
                      }
                      lVar35 = vpextrq_avx(auVar97,1);
                    }
                    iVar20 = iVar46;
                    if ((s1_end != 0) && ((uVar1 & 0x7ffffffc) != 0)) {
                      uVar31 = 0;
                      lVar36 = lVar35;
                      do {
                        iVar39 = ((uint)uVar31 & 3) * uVar49 + ((uint)(uVar31 >> 2) & 0x3fffffff);
                        lVar35 = lVar36;
                        iVar29 = iVar20;
                        iVar12 = local_26c;
                        if ((iVar39 < (int)uVar3) &&
                           (lVar35 = (*palVar52)[uVar31], iVar29 = iVar39, iVar12 = iVar19,
                           lVar35 <= lVar36)) {
                          if (iVar20 <= iVar39) {
                            iVar39 = iVar20;
                          }
                          if (local_26c != iVar19) {
                            iVar39 = iVar20;
                          }
                          bVar56 = lVar35 == lVar36;
                          lVar35 = lVar36;
                          iVar29 = iVar20;
                          iVar12 = local_26c;
                          if (bVar56) {
                            iVar29 = iVar39;
                          }
                        }
                        local_26c = iVar12;
                        iVar20 = iVar29;
                        uVar31 = uVar31 + 1;
                        lVar36 = lVar35;
                      } while ((uVar49 & 0x1fffffff) << 2 != (int)uVar31);
                    }
                    iVar39 = (int)lVar35;
                    if (s2_end == 0 && s1_end == 0) {
                      alVar2 = palVar52[uVar27];
                      auVar88 = alVar2._16_16_;
                      if (iVar13 < 3) {
                        iVar20 = 1;
                        if (1 < iVar28) {
                          iVar20 = iVar28;
                        }
                        do {
                          auVar8 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2
                                                   ,8);
                          alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar8,8);
                          auVar88 = alVar2._16_16_;
                          iVar20 = iVar20 + -1;
                        } while (iVar20 != 0);
                      }
                      uVar45 = vpextrq_avx(auVar88,1);
                      iVar39 = (int)uVar45;
                      iVar20 = iVar46;
                      local_26c = iVar19;
                    }
                    auVar10._8_8_ = lVar22;
                    auVar10._0_8_ = lVar22;
                    auVar10._16_8_ = lVar22;
                    auVar10._24_8_ = lVar22;
                    auVar8 = vpcmpgtq_avx2(auVar10,auVar86);
                    auVar85 = vpcmpgtq_avx2(auVar82,auVar85);
                    auVar85 = vpor_avx2(auVar85,auVar8);
                    if ((((auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         SUB321(auVar85 >> 0x7f,0) != '\0') || SUB321(auVar85 >> 0xbf,0) != '\0') ||
                        auVar85[0x1f] < '\0') {
                      *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                      iVar39 = 0;
                      local_26c = 0;
                      iVar20 = 0;
                    }
                    ppVar14->score = iVar39;
                    ppVar14->end_query = iVar20;
                    ppVar14->end_ref = local_26c;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(palVar52);
                    return ppVar14;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}